

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,PragmaFunction *function)

{
  CreatePragmaFunctionInfo info;
  PragmaFunction local_2e0;
  CreatePragmaFunctionInfo local_1c8;
  
  PragmaFunction::PragmaFunction(&local_2e0,function);
  CreatePragmaFunctionInfo::CreatePragmaFunctionInfo(&local_1c8,&local_2e0);
  PragmaFunction::~PragmaFunction(&local_2e0);
  local_1c8.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreatePragmaFunction(this->catalog,this->transaction,&local_1c8);
  CreatePragmaFunctionInfo::~CreatePragmaFunctionInfo(&local_1c8);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(PragmaFunction function) {
	CreatePragmaFunctionInfo info(std::move(function));
	info.internal = true;
	catalog.CreatePragmaFunction(transaction, info);
}